

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty_file(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_tty_t tty;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 != 0) {
    pcVar5 = "0 == uv_loop_init(&loop)";
    uVar4 = 0x165;
    goto LAB_00169e4f;
  }
  iVar1 = open64("test/fixtures/empty_file",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    if (iVar2 != -0x16) {
      pcVar5 = "UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)";
      uVar4 = 0x169;
      goto LAB_00169e4f;
    }
    iVar2 = close(iVar1);
    if (iVar2 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x16a;
      goto LAB_00169e4f;
    }
    iVar1 = uv_tty_init(&loop,&tty,iVar1,1);
    if (iVar1 != -0x16) {
      pcVar5 = "UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)";
      uVar4 = 0x16c;
      goto LAB_00169e4f;
    }
  }
  iVar1 = open64("/dev/random",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    if (iVar2 != -0x16) {
      pcVar5 = "UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)";
      uVar4 = 0x173;
      goto LAB_00169e4f;
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x174;
      goto LAB_00169e4f;
    }
  }
  iVar1 = open64("/dev/zero",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    if (iVar2 != -0x16) {
      pcVar5 = "UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)";
      uVar4 = 0x17a;
      goto LAB_00169e4f;
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x17b;
      goto LAB_00169e4f;
    }
  }
  iVar1 = open64("/dev/tty",2);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty,iVar1,1);
    if (iVar2 != 0) {
      pcVar5 = "0 == uv_tty_init(&loop, &tty, fd, 1)";
      uVar4 = 0x180;
      goto LAB_00169e4f;
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x181;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty);
    if (iVar1 == 0) {
      pcVar5 = "uv_is_readable((uv_stream_t*) &tty)";
      uVar4 = 0x182;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty);
    if (iVar1 == 0) {
      pcVar5 = "uv_is_writable((uv_stream_t*) &tty)";
      uVar4 = 0x183;
      goto LAB_00169e4f;
    }
    uv_close((uv_handle_t *)&tty,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_readable((uv_stream_t*) &tty)";
      uVar4 = 0x185;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_writable((uv_stream_t*) &tty)";
      uVar4 = 0x186;
      goto LAB_00169e4f;
    }
  }
  iVar1 = open64("/dev/tty",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty_ro,iVar1,1);
    if (iVar2 != 0) {
      pcVar5 = "0 == uv_tty_init(&loop, &tty_ro, fd, 1)";
      uVar4 = 0x18b;
      goto LAB_00169e4f;
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x18c;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty_ro);
    if (iVar1 == 0) {
      pcVar5 = "uv_is_readable((uv_stream_t*) &tty_ro)";
      uVar4 = 0x18d;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_ro);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_writable((uv_stream_t*) &tty_ro)";
      uVar4 = 0x18e;
      goto LAB_00169e4f;
    }
    uv_close((uv_handle_t *)&tty_ro,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty_ro);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_readable((uv_stream_t*) &tty_ro)";
      uVar4 = 400;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_ro);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_writable((uv_stream_t*) &tty_ro)";
      uVar4 = 0x191;
      goto LAB_00169e4f;
    }
  }
  iVar1 = open64("/dev/tty",1);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&loop,&tty_wo,iVar1,0);
    if (iVar2 != 0) {
      pcVar5 = "0 == uv_tty_init(&loop, &tty_wo, fd, 0)";
      uVar4 = 0x196;
      goto LAB_00169e4f;
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      pcVar5 = "0 == close(fd)";
      uVar4 = 0x197;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_readable((uv_stream_t*) &tty_wo)";
      uVar4 = 0x198;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo);
    if (iVar1 == 0) {
      pcVar5 = "uv_is_writable((uv_stream_t*) &tty_wo)";
      uVar4 = 0x199;
      goto LAB_00169e4f;
    }
    uv_close((uv_handle_t *)&tty_wo,(uv_close_cb)0x0);
    iVar1 = uv_is_readable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_readable((uv_stream_t*) &tty_wo)";
      uVar4 = 0x19b;
      goto LAB_00169e4f;
    }
    iVar1 = uv_is_writable((uv_stream_t *)&tty_wo);
    if (iVar1 != 0) {
      pcVar5 = "!uv_is_writable((uv_stream_t*) &tty_wo)";
      uVar4 = 0x19c;
      goto LAB_00169e4f;
    }
  }
  iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    iVar1 = uv_loop_close(&loop);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar5 = "0 == uv_loop_close(uv_default_loop())";
      uVar4 = 0x1a3;
    }
    else {
      pcVar5 = "0 == uv_loop_close(&loop)";
      uVar4 = 0x1a1;
    }
  }
  else {
    pcVar5 = "0 == uv_run(&loop, UV_RUN_DEFAULT)";
    uVar4 = 0x1a0;
  }
LAB_00169e4f:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
          uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT(0 == uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
    /* test EBADF handling */
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}